

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

QPartialOrdering QVariant::compare(QVariant *lhs,QVariant *rhs)

{
  ulong uVar1;
  PrivateShared *pPVar2;
  bool bVar3;
  QPartialOrdering QVar4;
  long in_FS_OFFSET;
  QMetaType t;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(lhs->d).field_0x18 & 0xfffffffffffffffc);
  local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(rhs->d).field_0x18 & 0xfffffffffffffffc);
  bVar3 = ::comparesEqual(&local_20,&local_28);
  uVar1 = *(ulong *)&(lhs->d).field_0x18;
  if (bVar3) {
    if ((uVar1 & 1) != 0) {
      pPVar2 = (lhs->d).data.shared;
      lhs = (QVariant *)
            ((long)&(pPVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                    super___atomic_base<int> + (long)pPVar2->offset);
    }
    if (((rhs->d).field_0x18 & 1) != 0) {
      pPVar2 = (rhs->d).data.shared;
      rhs = (QVariant *)
            ((long)&(pPVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                    super___atomic_base<int> + (long)pPVar2->offset);
    }
    QVar4 = QMetaType::compare(&local_20,lhs,rhs);
  }
  else {
    bVar3 = canBeNumericallyCompared
                      ((QMetaTypeInterface *)(uVar1 & 0xfffffffffffffffc),
                       (QMetaTypeInterface *)(*(ulong *)&(rhs->d).field_0x18 & 0xfffffffffffffffc));
    if (bVar3) {
      QVar4 = numericCompare(&lhs->d,&rhs->d);
    }
    else {
      bVar3 = qvCanConvertMetaObject
                        ((QMetaTypeInterface *)(*(ulong *)&(lhs->d).field_0x18 & 0xfffffffffffffffc)
                         ,(QMetaTypeInterface *)
                          (*(ulong *)&(rhs->d).field_0x18 & 0xfffffffffffffffc));
      QVar4.m_order = -0x7f;
      if (bVar3) {
        QVar4 = pointerCompare(&lhs->d,&rhs->d);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QPartialOrdering)QVar4.m_order;
  }
  __stack_chk_fail();
}

Assistant:

QPartialOrdering QVariant::compare(const QVariant &lhs, const QVariant &rhs)
{
    QMetaType t = lhs.d.type();
    if (t != rhs.d.type()) {
        // try numeric comparisons, with C++ type promotion rules (no conversion)
        if (canBeNumericallyCompared(lhs.d.type().iface(), rhs.d.type().iface()))
            return numericCompare(&lhs.d, &rhs.d);
        if (qvCanConvertMetaObject(lhs.metaType(), rhs.metaType()))
            return pointerCompare(&lhs.d, &rhs.d);
        return QPartialOrdering::Unordered;
    }
    return t.compare(lhs.constData(), rhs.constData());
}